

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::SetPropertyWPCache<int>
               (Var receiver,RecyclableObject *object,int propertyKey,Var newValue,
               ScriptContext *requestContext,PropertyOperationFlags propertyOperationFlags,
               PropertyValueInfo *info)

{
  ImplicitCallFlags *pIVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  PolymorphicInlineCache *polymorphicInlineCache;
  UnscopablesWrapperObject *pUVar9;
  JavascriptProxy *this;
  RecyclableObject *pRVar10;
  ScriptContext *pSVar11;
  ulong uVar12;
  undefined1 local_90 [8];
  PropertyDescriptor existingDesc;
  DescriptorFlags local_54;
  Var pvStack_50;
  DescriptorFlags flags;
  RecyclableObject *local_48;
  Var local_40;
  Var setterValueOrProxy;
  
  if (receiver == (Var)0x0) {
    return 0;
  }
  pvStack_50 = newValue;
  setterValueOrProxy = requestContext;
  if (object == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x9b0,"(object)","object");
    if (!bVar3) goto LAB_00ae05bd;
    *puVar8 = 0;
  }
  pSVar11 = (ScriptContext *)setterValueOrProxy;
  bVar3 = VarIs<Js::RecyclableObject>(receiver);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x9b1,"(!TaggedNumber::Is(receiver))","!TaggedNumber::Is(receiver)"
                               );
    if (!bVar3) goto LAB_00ae05bd;
    *puVar8 = 0;
    pSVar11 = (ScriptContext *)setterValueOrProxy;
  }
  local_40 = (Var)0x0;
  local_54 = None;
  BVar5 = CheckPrototypesForAccessorOrNonWritableProperty
                    (object,propertyKey,&local_40,&local_54,info,pSVar11);
  if (BVar5 == 0) {
    BVar5 = IsObject(receiver);
    if (BVar5 == 0) {
LAB_00ae046d:
      JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,pSVar11);
LAB_00ae0478:
      bVar3 = false;
      BVar5 = 0;
      goto LAB_00ae059d;
    }
    pRVar10 = VarTo<Js::RecyclableObject>(receiver);
    uVar12 = (ulong)propertyOperationFlags;
    local_48 = pRVar10;
    if ((RecyclableObject *)receiver != object) {
      existingDesc._40_8_ = (ulong)propertyOperationFlags;
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_90);
      BVar5 = GetOwnPropertyDescriptor(pRVar10,propertyKey,pSVar11,(PropertyDescriptor *)local_90);
      pSVar11 = (ScriptContext *)setterValueOrProxy;
      uVar12 = existingDesc._40_8_;
      if ((BVar5 != 0) &&
         (existingDesc.originalVar.ptr._5_1_ != '\0' || existingDesc.originalVar.ptr._4_1_ != '\0'))
      goto LAB_00ae0478;
    }
    setterValueOrProxy = (object->type).ptr;
    iVar6 = (*(local_48->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x17])
                      (local_48,(ulong)(uint)propertyKey,pvStack_50,uVar12 & 0xffffffff,info);
    if (iVar6 == 0) {
      BVar5 = 0;
      bVar3 = true;
      goto LAB_00ae059d;
    }
    bVar3 = VarIs<Js::JavascriptProxy>(receiver);
    BVar5 = 1;
    if ((((!bVar3) && (info->propertyRecordUsageCache != (PropertyRecordUsageCache *)0x0)) &&
        (info->flags != InlineCacheSetterFlag)) &&
       (BVar7 = RecyclableObject::IsExternal(object), BVar7 == 0)) {
      pRVar10 = VarTo<Js::RecyclableObject>(receiver);
      bVar3 = false;
      CacheOperators::CachePropertyWrite
                (pRVar10,false,(Type *)setterValueOrProxy,
                 ((info->propertyRecordUsageCache->propertyRecord).ptr)->pid,info,pSVar11);
      if (info->m_instance == local_48) {
        polymorphicInlineCache =
             PropertyRecordUsageCache::GetLdElemInlineCache(info->propertyRecordUsageCache);
        PropertyValueInfo::SetCacheInfo
                  (info,polymorphicInlineCache,info->allowResizingPolymorphicInlineCache);
        bVar3 = false;
        CacheOperators::CachePropertyRead
                  (object,local_48,false,((info->propertyRecordUsageCache->propertyRecord).ptr)->pid
                   ,false,info,pSVar11);
      }
      goto LAB_00ae059d;
    }
  }
  else if ((local_54 & Accessor) == None) {
    if ((local_54 & Proxy) == None) {
      if ((local_54 & WritableData) != Data) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x9dc,"((flags & Data) == Data && (flags & Writable) == None)",
                                    "(flags & Data) == Data && (flags & Writable) == None");
        if (!bVar3) goto LAB_00ae05bd;
        *puVar8 = 0;
        pSVar11 = (ScriptContext *)setterValueOrProxy;
      }
      pIVar1 = &pSVar11->threadContext->implicitCallFlags;
      *pIVar1 = *pIVar1 | ImplicitCall_NoOpSet;
      goto LAB_00ae046d;
    }
    bVar3 = VarIs<Js::JavascriptProxy>(local_40);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x9ce,"(VarIs<JavascriptProxy>(setterValueOrProxy))",
                                  "VarIs<JavascriptProxy>(setterValueOrProxy)");
      if (!bVar3) {
LAB_00ae05bd:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
      pSVar11 = (ScriptContext *)setterValueOrProxy;
    }
    this = VarTo<Js::JavascriptProxy>(local_40);
    if ((info != (PropertyValueInfo *)0x0) &&
       (info->propertyRecordUsageCache != (PropertyRecordUsageCache *)0x0)) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
      *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag | disablePrototypeCacheFlag;
    }
    BVar5 = JavascriptProxy::SetPropertyTrap
                      (this,receiver,SetPropertyWPCacheKind,propertyKey,pvStack_50,pSVar11,
                       propertyOperationFlags,0);
  }
  else {
    bVar4 = JavascriptError::ThrowIfStrictModeUndefinedSetter
                      (propertyOperationFlags,local_40,pSVar11);
    BVar5 = 1;
    bVar3 = false;
    if ((bVar4) || (local_40 == (Var)0x0)) goto LAB_00ae059d;
    bVar3 = VarIs<Js::UnscopablesWrapperObject>(receiver);
    pSVar11 = (ScriptContext *)setterValueOrProxy;
    if (bVar3) {
      pUVar9 = UnsafeVarTo<Js::UnscopablesWrapperObject>(receiver);
      receiver = (pUVar9->wrappedObject).ptr;
      pSVar11 = (ScriptContext *)setterValueOrProxy;
    }
    else if (((info->propertyRecordUsageCache != (PropertyRecordUsageCache *)0x0) &&
             (local_40 != (Var)0x0)) &&
            (*(Var *)(*(long *)((long)setterValueOrProxy + 8) + 0x150) != local_40)) {
      pRVar10 = VarTo<Js::RecyclableObject>(receiver);
      CacheOperators::CachePropertyWrite
                (pRVar10,false,(object->type).ptr,
                 ((info->propertyRecordUsageCache->propertyRecord).ptr)->pid,info,pSVar11);
    }
    pRVar10 = VarTo<Js::RecyclableObject>(local_40);
    CallSetter(pRVar10,receiver,pvStack_50,pSVar11);
  }
  bVar3 = false;
LAB_00ae059d:
  if (bVar3) {
    return 0;
  }
  return BVar5;
}

Assistant:

BOOL JavascriptOperators::SetPropertyWPCache(Var receiver, RecyclableObject* object, PropertyKeyType propertyKey, Var newValue, ScriptContext* requestContext, PropertyOperationFlags propertyOperationFlags, _Inout_ PropertyValueInfo * info)
    {
        if (receiver)
        {
            AnalysisAssert(object);
            Assert(!TaggedNumber::Is(receiver));
            Var setterValueOrProxy = nullptr;
            DescriptorFlags flags = None;
            if (JavascriptOperators::CheckPrototypesForAccessorOrNonWritableProperty(object, propertyKey, &setterValueOrProxy, &flags, info, requestContext))
            {
                if ((flags & Accessor) == Accessor)
                {
                    if (JavascriptError::ThrowIfStrictModeUndefinedSetter(propertyOperationFlags, setterValueOrProxy, requestContext))
                    {
                        return TRUE;
                    }
                    if (setterValueOrProxy)
                    {
                        if (VarIs<UnscopablesWrapperObject>(receiver))
                        {
                            receiver = (UnsafeVarTo<UnscopablesWrapperObject>(receiver))->GetWrappedObject();
                        }
                        else if (info->GetPropertyRecordUsageCache() && !JavascriptOperators::IsUndefinedAccessor(setterValueOrProxy, requestContext))
                        {
                            CacheOperators::CachePropertyWrite(VarTo<RecyclableObject>(receiver), false, object->GetType(), info->GetPropertyRecordUsageCache()->GetPropertyRecord()->GetPropertyId(), info, requestContext);
                        }
                        RecyclableObject* func = VarTo<RecyclableObject>(setterValueOrProxy);

                        JavascriptOperators::CallSetter(func, receiver, newValue, requestContext);
                    }
                    return TRUE;
                }
                else if ((flags & Proxy) == Proxy)
                {
                    Assert(VarIs<JavascriptProxy>(setterValueOrProxy));
                    JavascriptProxy* proxy = VarTo<JavascriptProxy>(setterValueOrProxy);
                    auto fn = [&](RecyclableObject* target) -> BOOL {
                        return JavascriptOperators::SetPropertyWPCache(receiver, target, propertyKey, newValue, requestContext, propertyOperationFlags, info);
                    };
                    if (info->GetPropertyRecordUsageCache())
                    {
                        PropertyValueInfo::SetNoCache(info, proxy);
                        PropertyValueInfo::DisablePrototypeCache(info, proxy);
                    }
                    return proxy->SetPropertyTrap(receiver, JavascriptProxy::SetPropertyTrapKind::SetPropertyWPCacheKind, propertyKey, newValue, requestContext, propertyOperationFlags);
                }
                else
                {
                    Assert((flags & Data) == Data && (flags & Writable) == None);

                    requestContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
                    JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
                    return FALSE;
                }
            }
            else if (!JavascriptOperators::IsObject(receiver))
            {
                JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
                return FALSE;
            }

            RecyclableObject* receiverObject = VarTo<RecyclableObject>(receiver);
            if (receiver != object)
            {
                // If the receiver object has the property and it is an accessor then return false
                PropertyDescriptor existingDesc;
                if (JavascriptOperators::GetOwnPropertyDescriptor(receiverObject, propertyKey, requestContext, &existingDesc)
                    && existingDesc.IsAccessorDescriptor())
                {
                    return FALSE;
                }
            }

            Type *typeWithoutProperty = object->GetType();
            // in 9.1.9, step 5, we should return false if receiver is not object, and that will happen in default RecyclableObject operation anyhow.
            if (receiverObject->SetProperty(propertyKey, newValue, propertyOperationFlags, info))
            {
                if (!VarIs<JavascriptProxy>(receiver) && info->GetPropertyRecordUsageCache() && info->GetFlags() != InlineCacheSetterFlag && !object->IsExternal())
                {
                    CacheOperators::CachePropertyWrite(VarTo<RecyclableObject>(receiver), false, typeWithoutProperty, info->GetPropertyRecordUsageCache()->GetPropertyRecord()->GetPropertyId(), info, requestContext);

                    if (info->GetInstance() == receiverObject)
                    {
                        PropertyValueInfo::SetCacheInfo(info, info->GetPropertyRecordUsageCache()->GetLdElemInlineCache(), info->AllowResizingPolymorphicInlineCache());
                        CacheOperators::CachePropertyRead(object, receiverObject, false, info->GetPropertyRecordUsageCache()->GetPropertyRecord()->GetPropertyId(), false, info, requestContext);
                    }
                }
                return TRUE;
            }
        }

        return FALSE;
    }